

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

wchar_t edit_pathname(bsdtar_conflict *bsdtar,archive_entry *entry)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  byte *pbVar7;
  char *pcVar8;
  wchar_t wVar9;
  byte *pbVar10;
  wchar_t wVar11;
  byte *pbVar12;
  bool bVar13;
  char *subst_name;
  char *local_30;
  
  pbVar7 = (byte *)archive_entry_pathname(entry);
  iVar6 = apply_substitution((bsdtar *)bsdtar,(char *)pbVar7,&local_30,0,0);
  if (iVar6 == 1) {
    archive_entry_copy_pathname(entry,local_30);
    cVar2 = *local_30;
    free(local_30);
    if (cVar2 == '\0') {
      return L'\xffffffff';
    }
    pbVar7 = (byte *)archive_entry_pathname(entry);
LAB_00111c59:
    pcVar8 = archive_entry_hardlink(entry);
    if (pcVar8 != (char *)0x0) {
      pcVar8 = archive_entry_hardlink(entry);
      iVar6 = apply_substitution((bsdtar *)bsdtar,pcVar8,&local_30,0,1);
      if (iVar6 == 1) {
        archive_entry_copy_hardlink(entry,local_30);
        free(local_30);
      }
      else if (iVar6 == -1) goto LAB_00111cea;
    }
    pcVar8 = archive_entry_symlink(entry);
    if (pcVar8 != (char *)0x0) {
      pcVar8 = archive_entry_symlink(entry);
      iVar6 = apply_substitution((bsdtar *)bsdtar,pcVar8,&local_30,1,0);
      if (iVar6 == 1) {
        archive_entry_copy_symlink(entry,local_30);
        free(local_30);
      }
      else if (iVar6 == -1) goto LAB_00111cea;
    }
    if (L'\0' < bsdtar->strip_components) {
      pcVar8 = archive_entry_hardlink(entry);
      wVar9 = bsdtar->strip_components;
      wVar11 = wVar9;
      while (L'\0' < wVar11) {
        if (*pbVar7 == 0x2f) {
          wVar11 = wVar11 + L'\xffffffff';
        }
        else if (*pbVar7 == 0) goto LAB_00111d62;
        pbVar7 = pbVar7 + 1;
      }
      for (; *pbVar7 == 0x2f; pbVar7 = pbVar7 + 1) {
      }
      if (*pbVar7 == 0) {
LAB_00111d62:
        pbVar7 = (byte *)0x0;
      }
      if (pbVar7 == (byte *)0x0) {
        return L'\x01';
      }
      if (pcVar8 != (char *)0x0) {
        while (L'\0' < wVar9) {
          if (*pcVar8 == '/') {
            wVar9 = wVar9 + L'\xffffffff';
          }
          else if (*pcVar8 == '\0') goto LAB_00111da0;
          pcVar8 = pcVar8 + 1;
        }
        for (; *pcVar8 == '/'; pcVar8 = pcVar8 + 1) {
        }
        if (*pcVar8 == '\0') {
LAB_00111da0:
          pcVar8 = (char *)0x0;
        }
        if (pcVar8 == (char *)0x0) {
          return L'\x01';
        }
        archive_entry_copy_hardlink(entry,pcVar8);
      }
    }
    if (bsdtar->option_absolute_paths == '\0') {
      bVar3 = *pbVar7;
      bVar5 = true;
      pbVar10 = pbVar7;
      if ((((bVar3 == 0x5c) || (bVar3 == 0x2f)) && ((pbVar7[1] == 0x5c || (pbVar7[1] == 0x2f)))) &&
         (((bVar4 = pbVar7[2], bVar4 == 0x3f || (bVar4 == 0x2e)) &&
          ((pbVar7[3] == 0x5c || (pbVar7[3] == 0x2f)))))) {
        if (((((bVar4 == 0x3f) && ((pbVar7[4] | 0x20) == 0x75)) && ((pbVar7[5] | 0x20) == 0x6e)) &&
            ((pbVar7[6] | 0x20) == 99)) && ((pbVar7[7] == 0x5c || (pbVar7[7] == 0x2f)))) {
          pbVar10 = pbVar7 + 8;
        }
        else {
          pbVar10 = pbVar7 + 4;
        }
        bVar5 = false;
      }
      do {
        pbVar1 = pbVar10;
        if ((byte)((*pbVar10 & 0xdf) + 0xbf) < 0x1a) {
          pbVar1 = pbVar10 + (ulong)(pbVar10[1] == 0x3a) * 2;
          if (pbVar10[1] == 0x3a) {
            bVar5 = false;
          }
        }
        while ((pbVar12 = pbVar1, *pbVar12 == 0x5c || (*pbVar12 == 0x2f))) {
          pbVar1 = pbVar12 + 1;
          if (((pbVar12[1] == 0x2e) && (pbVar12[2] == 0x2e)) &&
             ((pbVar12[3] == 0x2f || (pbVar12[3] == 0x5c)))) {
            pbVar1 = pbVar12 + 3;
            bVar5 = false;
          }
        }
        bVar13 = pbVar12 != pbVar10;
        pbVar10 = pbVar12;
      } while (bVar13);
      if ((pbVar12 != pbVar7) && (bsdtar->warned_lead_slash == '\0')) {
        if (bVar5) {
          lafe_warnc(0,"Removing leading \'%c\' from member names",(ulong)(uint)(int)(char)bVar3);
        }
        else {
          lafe_warnc(0,"Removing leading drive letter from member names",
                     (ulong)(uint)(int)(char)bVar3);
        }
        bsdtar->warned_lead_slash = '\x01';
      }
      pbVar10 = (byte *)0x175585;
      if (*pbVar12 != 0) {
        pbVar10 = pbVar12;
      }
    }
    else {
      do {
        pbVar10 = pbVar7;
        if (*pbVar10 != 0x2f) break;
        pbVar7 = pbVar10 + 1;
      } while (pbVar10[1] == 0x2f);
    }
    pbVar7 = (byte *)archive_entry_pathname(entry);
    wVar9 = L'\0';
    if (pbVar10 != pbVar7) {
      pcVar8 = strdup((char *)pbVar10);
      archive_entry_copy_pathname(entry,pcVar8);
      free(pcVar8);
    }
  }
  else {
    if (iVar6 != -1) goto LAB_00111c59;
LAB_00111cea:
    lafe_warnc(0,"Invalid substitution, skipping entry");
    wVar9 = L'\x01';
  }
  return wVar9;
}

Assistant:

int
edit_pathname(struct bsdtar *bsdtar, struct archive_entry *entry)
{
	const char *name = archive_entry_pathname(entry);
#if defined(HAVE_REGEX_H) || defined(HAVE_PCREPOSIX_H)
	char *subst_name;
	int r;

	r = apply_substitution(bsdtar, name, &subst_name, 0, 0);
	if (r == -1) {
		lafe_warnc(0, "Invalid substitution, skipping entry");
		return 1;
	}
	if (r == 1) {
		archive_entry_copy_pathname(entry, subst_name);
		if (*subst_name == '\0') {
			free(subst_name);
			return -1;
		} else
			free(subst_name);
		name = archive_entry_pathname(entry);
	}

	if (archive_entry_hardlink(entry)) {
		r = apply_substitution(bsdtar, archive_entry_hardlink(entry), &subst_name, 0, 1);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_hardlink(entry, subst_name);
			free(subst_name);
		}
	}
	if (archive_entry_symlink(entry) != NULL) {
		r = apply_substitution(bsdtar, archive_entry_symlink(entry), &subst_name, 1, 0);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_symlink(entry, subst_name);
			free(subst_name);
		}
	}
#endif

	/* Strip leading dir names as per --strip-components option. */
	if (bsdtar->strip_components > 0) {
		const char *linkname = archive_entry_hardlink(entry);

		name = strip_components(name, bsdtar->strip_components);
		if (name == NULL)
			return (1);

		if (linkname != NULL) {
			linkname = strip_components(linkname,
			    bsdtar->strip_components);
			if (linkname == NULL)
				return (1);
			archive_entry_copy_hardlink(entry, linkname);
		}
	}

	/* By default, don't write or restore absolute pathnames. */
	if (!bsdtar->option_absolute_paths) {
		const char *rp, *p = name;
		int slashonly = 1;

		/* Remove leading "//./" or "//?/" or "//?/UNC/"
		 * (absolute path prefixes used by Windows API) */
		if ((p[0] == '/' || p[0] == '\\') &&
		    (p[1] == '/' || p[1] == '\\') &&
		    (p[2] == '.' || p[2] == '?') &&
		    (p[3] == '/' || p[3] == '\\'))
		{
			if (p[2] == '?' &&
			    (p[4] == 'U' || p[4] == 'u') &&
			    (p[5] == 'N' || p[5] == 'n') &&
			    (p[6] == 'C' || p[6] == 'c') &&
			    (p[7] == '/' || p[7] == '\\'))
				p += 8;
			else
				p += 4;
			slashonly = 0;
		}
		do {
			rp = p;
			/* Remove leading drive letter from archives created
			 * on Windows. */
			if (((p[0] >= 'a' && p[0] <= 'z') ||
			     (p[0] >= 'A' && p[0] <= 'Z')) &&
				 p[1] == ':') {
				p += 2;
				slashonly = 0;
			}
			/* Remove leading "/../", "//", etc. */
			while (p[0] == '/' || p[0] == '\\') {
				if (p[1] == '.' && p[2] == '.' &&
					(p[3] == '/' || p[3] == '\\')) {
					p += 3; /* Remove "/..", leave "/"
							 * for next pass. */
					slashonly = 0;
				} else
					p += 1; /* Remove "/". */
			}
		} while (rp != p);

		if (p != name && !bsdtar->warned_lead_slash) {
			/* Generate a warning the first time this happens. */
			if (slashonly)
				lafe_warnc(0,
				    "Removing leading '%c' from member names",
				    name[0]);
			else
				lafe_warnc(0,
				    "Removing leading drive letter from "
				    "member names");
			bsdtar->warned_lead_slash = 1;
		}

		/* Special case: Stripping everything yields ".". */
		if (*p == '\0')
			name = ".";
		else
			name = p;
	} else {
		/* Strip redundant leading '/' characters. */
		while (name[0] == '/' && name[1] == '/')
			name++;
	}

	/* Safely replace name in archive_entry. */
	if (name != archive_entry_pathname(entry)) {
		char *q = strdup(name);
		archive_entry_copy_pathname(entry, q);
		free(q);
	}
	return (0);
}